

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::JsonReporter::listTests
          (JsonReporter *this,
          vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *tests)

{
  pointer pTVar1;
  TestCaseInfo *value;
  StringRef *pSVar2;
  size_t __n;
  Tag *tag;
  StringRef *value_00;
  int __fd;
  _Elt_pointer pJVar3;
  pointer pTVar4;
  JsonArrayWriter writer;
  JsonArrayWriter tag_writer;
  JsonObjectWriter desc_writer;
  JsonValueWriter local_1c8;
  
  startListing(this);
  pJVar3 = (this->m_objectWriters).c.
           super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pJVar3 == (this->m_objectWriters).c.
                super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
    pJVar3 = (this->m_objectWriters).c.
             super__Deque_base<Catch::JsonObjectWriter,_std::allocator<Catch::JsonObjectWriter>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
  }
  JsonObjectWriter::write((JsonObjectWriter *)&local_1c8,(int)pJVar3 + -0x18,"tests",5);
  JsonValueWriter::writeArray(&writer,&local_1c8);
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8.m_sstream);
  pTVar1 = (tests->super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  for (pTVar4 = (tests->
                super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
                _M_impl.super__Vector_impl_data._M_start; pTVar4 != pTVar1; pTVar4 = pTVar4 + 1) {
    JsonArrayWriter::writeObject(&desc_writer,&writer);
    value = pTVar4->m_info;
    __fd = (int)&desc_writer;
    JsonObjectWriter::write((JsonObjectWriter *)&local_1c8,__fd,"name",4);
    JsonValueWriter::write<std::__cxx11::string>(&local_1c8,&value->name);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8.m_sstream);
    __n = 10;
    JsonObjectWriter::write((JsonObjectWriter *)&local_1c8,__fd,"class-name",10);
    JsonValueWriter::write
              (&local_1c8,(int)(value->className).m_start,(void *)(value->className).m_size,__n);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8.m_sstream);
    JsonObjectWriter::write((JsonObjectWriter *)&local_1c8,__fd,"tags",4);
    JsonValueWriter::writeArray(&tag_writer,&local_1c8);
    std::__cxx11::stringstream::~stringstream((stringstream *)&local_1c8.m_sstream);
    pSVar2 = &((value->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>._M_impl.
               super__Vector_impl_data._M_finish)->original;
    for (value_00 = &((value->tags).super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>.
                      _M_impl.super__Vector_impl_data._M_start)->original; value_00 != pSVar2;
        value_00 = value_00 + 1) {
      JsonArrayWriter::writeImpl<Catch::StringRef>(&tag_writer,value_00);
    }
    JsonArrayWriter::~JsonArrayWriter(&tag_writer);
    anon_unknown_26::writeSourceInfo(&desc_writer,&value->lineInfo);
    JsonObjectWriter::~JsonObjectWriter(&desc_writer);
  }
  JsonArrayWriter::~JsonArrayWriter(&writer);
  return;
}

Assistant:

void JsonReporter::listTests( std::vector<TestCaseHandle> const& tests ) {
        startListing();

        auto writer = m_objectWriters.top().write( "tests"_sr ).writeArray();

        for ( auto const& test : tests ) {
            auto desc_writer = writer.writeObject();
            auto const& info = test.getTestCaseInfo();

            desc_writer.write( "name"_sr ).write( info.name );
            desc_writer.write( "class-name"_sr ).write( info.className );
            {
                auto tag_writer = desc_writer.write( "tags"_sr ).writeArray();
                for ( auto const& tag : info.tags ) {
                    tag_writer.write( tag.original );
                }
            }
            writeSourceInfo( desc_writer, info.lineInfo );
        }
    }